

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O1

void __thiscall Assimp::XFileParser::readHeadOfDataObject(XFileParser *this,string *poName)

{
  Scene *this_00;
  int iVar1;
  string nameOrBrace;
  string local_60;
  string local_40;
  
  GetNextToken_abi_cxx11_(&local_40,this);
  iVar1 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar1 != 0) {
    if (poName != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)poName);
    }
    GetNextToken_abi_cxx11_(&local_60,this);
    iVar1 = std::__cxx11::string::compare((char *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (iVar1 != 0) {
      this_00 = this->mScene;
      if (this_00 != (Scene *)0x0) {
        XFile::Scene::~Scene(this_00);
        operator_delete(this_00,0x58);
      }
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Opening brace expected.","");
      ThrowException(this,&local_60);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void XFileParser::readHeadOfDataObject( std::string* poName)
{
    std::string nameOrBrace = GetNextToken();
    if( nameOrBrace != "{")
    {
        if( poName)
            *poName = nameOrBrace;

        if ( GetNextToken() != "{" ) {
            delete mScene;
            ThrowException( "Opening brace expected." );
        }
    }
}